

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# downloader-libcurl.cpp
# Opt level: O3

size_t Downloader_libcurl::fetchDownloadedData(char *ptr,size_t size,size_t nmemb,void *stream)

{
  uint uVar1;
  int iVar2;
  void *__ptr;
  long lVar3;
  size_t __n;
  ulong uVar4;
  
  __ptr = *(void **)((long)stream + 8);
  uVar1 = *(uint *)((long)stream + 4);
  uVar4 = (ulong)uVar1;
  if (__ptr == (void *)0x0) {
    __ptr = malloc((long)(int)uVar1);
    *(void **)((long)stream + 8) = __ptr;
    if (__ptr == (void *)0x0) {
      return 0xffffffffffffffff;
    }
  }
  __n = nmemb * size;
  lVar3 = (long)*stream;
  if ((ulong)(long)(int)uVar1 < __n + lVar3) {
    do {
      iVar2 = (int)uVar4 * 2;
      *(int *)((long)stream + 4) = iVar2;
      __ptr = realloc(__ptr,(long)iVar2);
      *(void **)((long)stream + 8) = __ptr;
      lVar3 = (long)*stream;
      uVar4 = (ulong)*(int *)((long)stream + 4);
    } while (uVar4 < __n + lVar3);
  }
  memcpy((void *)((long)__ptr + lVar3),ptr,__n);
  *(int *)stream = *stream + (int)__n;
  return __n;
}

Assistant:

size_t Downloader_libcurl::fetchDownloadedData(char *ptr, size_t size, size_t nmemb, void *stream)
{
    auto *mem = (memBlockStruc *)stream;

    if(mem->memBlock == nullptr) mem->memBlock = (char *)malloc(mem->allocSize);
    if(mem->memBlock == nullptr) return -1;
    while(mem->realSize + size * nmemb > mem->allocSize)
    {
        mem->allocSize <<= 1;
        mem->memBlock = (char *)realloc(mem->memBlock, mem->allocSize);
    }

    memcpy(&(mem->memBlock[mem->realSize]), ptr, size * nmemb);
    mem->realSize += size * nmemb;
    return size * nmemb;
}